

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

void __thiscall Js::ConfigFlagsTable::FlagSetCallback_ES6All(ConfigFlagsTable *this,Boolean value)

{
  Flag local_16;
  Boolean childValue;
  Flag childFlag;
  Flag parentFlag;
  Boolean value_local;
  ConfigFlagsTable *this_local;
  
  for (local_16 = GetNextChildFlag(this,ES6Flag,InvalidFlag); local_16 != InvalidFlag;
      local_16 = GetNextChildFlag(this,ES6Flag,local_16)) {
    if (local_16 != ES6VerboseFlag) {
      Output::VerboseNote(L"FLAG %s = %d - setting child flag %s = %d\n",0x3e7c3c,(ulong)value,
                          *(undefined8 *)(FlagNames + (long)(int)(uint)local_16 * 8),(ulong)value);
      SetAsBoolean(this,local_16,value);
    }
  }
  return;
}

Assistant:

void
    ConfigFlagsTable::FlagSetCallback_ES6All(Boolean value)
    {
        // iterate through all ES6 flags - and set them explicitly (except ES6Verbose)
        Flag parentFlag = ES6Flag;

        // parent ES6 flag, will iterate through all child ES6 flags
        Flag childFlag = GetNextChildFlag(parentFlag, /* no currentChildFlag */ InvalidFlag);
        while (childFlag != InvalidFlag)
        {
            // skip verbose
            if (childFlag != ES6VerboseFlag)
            {
                Boolean childValue = value;

                Output::VerboseNote(_u("FLAG %s = %d - setting child flag %s = %d\n"), FlagNames[(int) parentFlag], value, FlagNames[(int) childFlag], childValue);
                this->SetAsBoolean(childFlag, childValue);
            }

            // get next child flag
            childFlag = GetNextChildFlag(parentFlag, /* currentChildFlag */ childFlag);
        }
    }